

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,__1,__1> __thiscall Matrix<double,_-1,_-1>::Zero(Matrix<double,__1,__1> *this)

{
  int i;
  int row;
  int j;
  int col;
  
  for (row = 0; row < this->rows; row = row + 1) {
    for (col = 0; col < this->cols; col = col + 1) {
      SetElement(this,row,col,0.0);
    }
  }
  return *this;
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::Zero()
{
    // 这样的实现方法会导致过多占用内存
    // 故不使用静态成员的方法实现
    // 2020 09 10
    // Matrix<Type, _0, _1> Zero;

    // 2020 09 11 
    // 恢复使用静态方法  问题已解决
    // Matrix<Type, _0, _1> Zero_;
    for (int i = 0; i < this->row(); ++i)
        for(int j = 0; j < this->col(); ++j)
            this->SetElement(i, j, 0);
    return (*this);
}